

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunHighs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  HighsPresolveStatus HVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char **ppcVar5;
  HighsPresolveStatus *pHVar6;
  char **in_RSI;
  HighsStatus write_model_status;
  HighsStatus basis_status_1;
  HighsStatus run_status;
  bool ok_to_write;
  HighsPresolveStatus model_presolve_status;
  HighsStatus status;
  HighsStatus read_solution_status;
  HighsStatus basis_status;
  HighsStatus read_status;
  CallForHelp *e;
  CallForAllHelp *e_1;
  RequiredError *e_2;
  ExtrasError *e_3;
  ArgumentMismatch *e_4;
  ParseError *e_5;
  string usage_msg;
  App app;
  HighsOptions loaded_options;
  HighsCommandLineOptions cmd_options;
  HighsLogOptions *log_options;
  HighsOptions *options;
  Highs highs;
  undefined4 in_stack_ffffffffffffa258;
  int in_stack_ffffffffffffa25c;
  undefined4 in_stack_ffffffffffffa260;
  int in_stack_ffffffffffffa264;
  undefined4 in_stack_ffffffffffffa268;
  undefined4 in_stack_ffffffffffffa26c;
  undefined4 in_stack_ffffffffffffa270;
  undefined4 in_stack_ffffffffffffa274;
  string *in_stack_ffffffffffffa2b0;
  string *in_stack_ffffffffffffa2b8;
  App *in_stack_ffffffffffffa2c0;
  undefined4 in_stack_ffffffffffffa340;
  undefined4 in_stack_ffffffffffffa344;
  allocator local_5ca9;
  string local_5ca8 [220];
  undefined4 local_5bcc;
  string local_5bc0 [39];
  allocator local_5b99;
  string local_5b98 [32];
  string local_5b78 [32];
  string local_5b58 [39];
  allocator local_5b31;
  string local_5b30 [39];
  allocator local_5b09;
  string local_5b08 [168];
  HighsOptions *in_stack_ffffffffffffa5a0;
  HighsCommandLineOptions *in_stack_ffffffffffffa5a8;
  HighsLogOptions *in_stack_ffffffffffffa5b0;
  App *in_stack_ffffffffffffa5b8;
  string local_5600 [80];
  byte local_55b0;
  undefined1 local_52f0 [256];
  HighsLogOptions *local_51f0;
  HighsOptions *local_51d8;
  string local_51d0 [728];
  HighsCommandLineOptions *in_stack_ffffffffffffb108;
  App *in_stack_ffffffffffffb110;
  int local_4;
  
  Highs::Highs((Highs *)local_51d0);
  local_51d8 = Highs::getOptions((Highs *)local_51d0);
  local_51f0 = &(local_51d8->super_HighsOptionsStruct).log_options;
  HighsCommandLineOptions::HighsCommandLineOptions
            ((HighsCommandLineOptions *)
             CONCAT44(in_stack_ffffffffffffa344,in_stack_ffffffffffffa340));
  HighsOptions::HighsOptions
            ((HighsOptions *)CONCAT44(in_stack_ffffffffffffa274,in_stack_ffffffffffffa270));
  std::__cxx11::string::operator=(local_5600,"HiGHS.log");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b08,"",&local_5b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b30,"",&local_5b31);
  CLI::App::App(in_stack_ffffffffffffa2c0,in_stack_ffffffffffffa2b8,in_stack_ffffffffffffa2b0);
  std::__cxx11::string::~string(local_5b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b31);
  std::__cxx11::string::~string(local_5b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b09);
  ppcVar5 = CLI::App::ensure_utf8((App *)(local_5b08 + 0x20),in_RSI);
  setupCommandLineOptions(in_stack_ffffffffffffb110,in_stack_ffffffffffffb108);
  pcVar2 = *ppcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b98,pcVar2,&local_5b99);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa26c,in_stack_ffffffffffffa268),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa26c,in_stack_ffffffffffffa268),
                 (char *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  std::__cxx11::string::~string(local_5b78);
  std::__cxx11::string::~string(local_5b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b99);
  std::__cxx11::string::string(local_5bc0,local_5b58);
  CLI::App::usage((App *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                  (string *)CONCAT44(in_stack_ffffffffffffa25c,in_stack_ffffffffffffa258));
  std::__cxx11::string::~string(local_5bc0);
  CLI::App::parse((App *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                  in_stack_ffffffffffffa25c,(char **)0x11e937);
  std::__cxx11::string::~string(local_5b58);
  bVar3 = loadOptions(in_stack_ffffffffffffa5b8,in_stack_ffffffffffffa5b0,in_stack_ffffffffffffa5a8,
                      in_stack_ffffffffffffa5a0);
  if (!bVar3) {
    local_4 = -1;
    goto LAB_0011f689;
  }
  if ((local_55b0 & 1) != 0) {
    Highs::openLogFile(local_51d0);
  }
  Highs::passOptions((HighsOptions *)local_51d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5ca8,"",&local_5ca9);
  Highs::writeOptions(local_51d0,SUB81(local_5ca8,0));
  std::__cxx11::string::~string(local_5ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5ca9);
  iVar4 = Highs::readModel(local_51d0);
  if (iVar4 == -1) {
    highsLogUser(local_51f0,kInfo,"Error loading file\n");
    local_4 = -1;
    goto LAB_0011f689;
  }
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                          (char *)CONCAT44(in_stack_ffffffffffffa25c,in_stack_ffffffffffffa258));
  if ((bVar3) && (iVar4 = Highs::readBasis(local_51d0), iVar4 == -1)) {
    highsLogUser(local_51f0,kInfo,"Error reading basis from file\n");
    local_4 = -1;
    goto LAB_0011f689;
  }
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                          (char *)CONCAT44(in_stack_ffffffffffffa25c,in_stack_ffffffffffffa258));
  if ((bVar3) && (iVar4 = Highs::readSolution(local_51d0,(int)local_52f0), iVar4 == -1)) {
    highsLogUser(local_51f0,kInfo,"Error loading solution file\n");
    local_4 = -1;
    goto LAB_0011f689;
  }
  if (((local_51d8->super_HighsOptionsStruct).write_presolved_model_to_file & 1U) != 0) {
    local_4 = Highs::presolve();
    if (local_4 != -1) {
      pHVar6 = Highs::getModelPresolveStatus((Highs *)local_51d0);
      HVar1 = *pHVar6;
      bVar3 = true;
      if (((HVar1 != kNotReduced) && (bVar3 = true, HVar1 != kReduced)) &&
         (bVar3 = true, HVar1 != kReducedToEmpty)) {
        bVar3 = HVar1 == kTimeout;
      }
      if (bVar3) {
        local_4 = Highs::writePresolvedModel(local_51d0);
      }
      else {
        highsLogUser(local_51f0,kInfo,"No presolved model to write to file\n");
      }
    }
    goto LAB_0011f689;
  }
  local_4 = Highs::run();
  if (local_4 == -1) goto LAB_0011f689;
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                          (char *)CONCAT44(in_stack_ffffffffffffa25c,in_stack_ffffffffffffa258));
  if ((bVar3) &&
     (in_stack_ffffffffffffa264 = Highs::writeBasis(local_51d0), in_stack_ffffffffffffa264 == -1)) {
    highsLogUser(local_51f0,kInfo,"Error writing basis to file\n");
    local_4 = -1;
    goto LAB_0011f689;
  }
  if (((local_51d8->super_HighsOptionsStruct).write_solution_to_file & 1U) == 0) {
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260),
                            (char *)CONCAT44(in_stack_ffffffffffffa25c,in_stack_ffffffffffffa258));
    in_stack_ffffffffffffa260 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffa260);
    if (bVar3) goto LAB_0011f5e2;
  }
  else {
LAB_0011f5e2:
    Highs::writeSolution(local_51d0,(int)local_51d8 + 0x90);
  }
  if ((((local_51d8->super_HighsOptionsStruct).write_model_to_file & 1U) != 0) &&
     (iVar4 = Highs::writeModel(local_51d0), iVar4 == -1)) {
    local_4 = -1;
  }
LAB_0011f689:
  local_5bcc = 1;
  CLI::App::~App((App *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  HighsOptions::~HighsOptions
            ((HighsOptions *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  HighsCommandLineOptions::~HighsCommandLineOptions
            ((HighsCommandLineOptions *)
             CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  Highs::~Highs((Highs *)CONCAT44(in_stack_ffffffffffffa264,in_stack_ffffffffffffa260));
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  // Create the Highs instance.
  Highs highs;
  const HighsOptions& options = highs.getOptions();
  const HighsLogOptions& log_options = options.log_options;

  // Load user options.
  HighsCommandLineOptions cmd_options;
  HighsOptions loaded_options;

  // Set "HiGHS.log" as the default log_file for the app so that
  // log_file has this value if it isn't set in the file
  loaded_options.log_file = "HiGHS.log";
  // When loading the options file, any messages are reported using
  // the default HighsLogOptions

  // Replace command line options parsing library
  // cxxopts now Cpp17 with
  // CLI11 for Cpp11

  CLI::App app{""};
  argv = app.ensure_utf8(argv);

  setupCommandLineOptions(app, cmd_options);

  try {
    std::string usage_msg =
        "usage:\n      " + std::string(argv[0]) + " [options] [file]";
    app.usage(usage_msg);

    app.parse(argc, argv);
  } catch (const CLI::CallForHelp& e) {
    std::cout << app.help() << std::endl;
    return 0;
  } catch (const CLI::CallForAllHelp& e) {
    std::cout << app.help();
    return 0;
  } catch (const CLI::RequiredError& e) {
    std::cout << "Please specify filename in .mps|.lp|.ems format."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ExtrasError& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Multiple files not supported." << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ArgumentMismatch& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Too many arguments provided. Please provide only one."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ParseError& e) {
    std::cout << e.what() << std::endl;
    // app.exit() should be called from main.
    return app.exit(e);
  }

  if (!loadOptions(app, log_options, cmd_options, loaded_options))
    return (int)HighsStatus::kError;

  // Open the app log file - unless output_flag is false, to avoid
  // creating an empty file. It does nothing if its name is "".
  if (loaded_options.output_flag) highs.openLogFile(loaded_options.log_file);

  // Pass the option settings to HiGHS. Only error-checking produces
  // output, but values are checked in loadOptions, so it's safe to
  // call this first so that printHighsVersionCopyright uses reporting
  // settings defined in any options file.
  highs.passOptions(loaded_options);
  //  highs.writeOptions("Options.md");
  highs.writeOptions("", true);

  // Load the model from model_file
  HighsStatus read_status = highs.readModel(cmd_options.model_file);
  if (read_status == HighsStatus::kError) {
    highsLogUser(log_options, HighsLogType::kInfo, "Error loading file\n");
    return (int)read_status;
  }

  if (cmd_options.cmd_read_basis_file != "") {
    HighsStatus basis_status = highs.readBasis(cmd_options.cmd_read_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error reading basis from file\n");
      return (int)basis_status;
    }
  }

  // Possible read a solution file
  if (cmd_options.read_solution_file != "") {
    HighsStatus read_solution_status =
        highs.readSolution(cmd_options.read_solution_file);
    if (read_solution_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error loading solution file\n");
      return (int)read_solution_status;
    }
  }
  if (options.write_presolved_model_to_file) {
    // Run presolve and write the presolved model to a file
    HighsStatus status = highs.presolve();
    if (status == HighsStatus::kError) return int(status);
    HighsPresolveStatus model_presolve_status = highs.getModelPresolveStatus();
    const bool ok_to_write =
        model_presolve_status == HighsPresolveStatus::kNotReduced ||
        model_presolve_status == HighsPresolveStatus::kReduced ||
        model_presolve_status == HighsPresolveStatus::kReducedToEmpty ||
        model_presolve_status == HighsPresolveStatus::kTimeout;
    if (!ok_to_write) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "No presolved model to write to file\n");
      return int(status);
    }
    status = highs.writePresolvedModel(options.write_presolved_model_file);
    return int(status);
  }
  // Solve the model
  HighsStatus run_status = highs.run();
  if (run_status == HighsStatus::kError) return int(run_status);

  // highs.writeInfo("Info.md");

  if (cmd_options.cmd_write_basis_file != "") {
    HighsStatus basis_status =
        highs.writeBasis(cmd_options.cmd_write_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error writing basis to file\n");

      return (int)basis_status;
    }
  }

  // Possibly write the solution to a file
  if (options.write_solution_to_file || options.solution_file != "")
    highs.writeSolution(options.solution_file, options.write_solution_style);

  // Possibly write the model to a file
  if (options.write_model_to_file) {
    HighsStatus write_model_status = highs.writeModel(options.write_model_file);
    if (write_model_status == HighsStatus::kError)
      return (int)write_model_status;  // todo: change to write model error
  }

  // Shut down task executor: optional and wip
  // HighsTaskExecutor::shutdown(true);

  return (int)run_status;
}